

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::CacheTestInstance::~CacheTestInstance(CacheTestInstance *this)

{
  code *pcVar1;
  CacheTestInstance *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CacheTestInstance::~CacheTestInstance (void)
{
}